

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

bool dg::vr::unsetRelated(Bucket *lt,Type type,Bucket *rt)

{
  reference_wrapper<dg::vr::Bucket> *__src;
  bool bVar1;
  uint uVar2;
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  __dest;
  reference_wrapper<dg::vr::Bucket> *prVar3;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>> *this;
  
  this = (VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)((lt->relatedBuckets)._M_elems + type)
  ;
  if (lt->id == rt->id) {
    bVar1 = VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>(this,rt);
    return bVar1;
  }
  uVar2 = dg::vr::Relations::inverted(type);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>,__gnu_cxx::__ops::_Iter_equals_val<dg::vr::Bucket_const>>
                     (*(undefined8 *)this,
                      (lt->relatedBuckets)._M_elems[type].vec.
                      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,rt);
  prVar3 = (lt->relatedBuckets)._M_elems[type].vec.
           super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current == prVar3) {
    bVar1 = false;
  }
  else {
    __src = __dest._M_current + 1;
    if (__src != prVar3) {
      memmove(__dest._M_current,__src,(long)prVar3 - (long)__src);
      prVar3 = (lt->relatedBuckets)._M_elems[type].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    (lt->relatedBuckets)._M_elems[type].vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar3 + -1;
    VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
              ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
               ((rt->relatedBuckets)._M_elems + uVar2),lt);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool unsetRelated(Bucket &lt, Relations::Type type, Bucket &rt) {
        assert(type != Relations::EQ);
        if (lt == rt) {
            return lt.relatedBuckets[type].erase(rt);
        }
        auto &ltRelated = lt.relatedBuckets[type];
        auto &rtRelated = rt.relatedBuckets[Relations::inverted(type)];

        auto found = ltRelated.find(rt);
        if (found == ltRelated.end()) {
            assert(!rtRelated.contains(lt));
            return false;
        }

        ltRelated.erase(found);
        rtRelated.erase(lt);
        return true;
    }